

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O0

void Js::JavascriptExceptionOperators::ThrowExceptionObjectInternal
               (JavascriptExceptionObject *exceptionObject,ScriptContext *scriptContext,
               bool fillExceptionContext,bool considerPassingToDebugger,PVOID returnAddress,
               bool resetStack)

{
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags IVar3;
  undefined4 *puVar4;
  Var thrownObject_00;
  uint64 stackCrawlLimit;
  StackTrace *stackTrace;
  ThreadContext *local_88;
  ThreadContext *threadContext_1;
  Var thrownObject;
  JavascriptExceptionContext exceptionContext;
  ThreadContext *threadContext;
  bool resetStack_local;
  PVOID returnAddress_local;
  bool considerPassingToDebugger_local;
  bool fillExceptionContext_local;
  ScriptContext *scriptContext_local;
  JavascriptExceptionObject *exceptionObject_local;
  
  if (scriptContext != (ScriptContext *)0x0) {
    exceptionContext.m_originalStackTrace.ptr =
         (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)ScriptContext::GetThreadContext(scriptContext);
    ThreadContext::SetNoJsReentrancy
              ((ThreadContext *)exceptionContext.m_originalStackTrace.ptr,false);
    if (fillExceptionContext) {
      if (exceptionObject == (JavascriptExceptionObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                           ,0x528,"(exceptionObject)","exceptionObject");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      JavascriptExceptionContext::JavascriptExceptionContext
                ((JavascriptExceptionContext *)&thrownObject);
      thrownObject_00 =
           JavascriptExceptionObject::GetThrownObject(exceptionObject,(ScriptContext *)0x0);
      stackCrawlLimit = StackCrawlLimitOnThrow(thrownObject_00,scriptContext);
      WalkStackForExceptionContext
                (scriptContext,(JavascriptExceptionContext *)&thrownObject,thrownObject_00,
                 stackCrawlLimit,returnAddress,true,resetStack);
      JavascriptExceptionObject::FillError
                (exceptionObject,(JavascriptExceptionContext *)&thrownObject,scriptContext,
                 (HostWrapperCreateFuncType)0x0);
      stackTrace = JavascriptExceptionContext::GetStackTrace
                             ((JavascriptExceptionContext *)&thrownObject);
      AddStackTraceToObject(thrownObject_00,stackTrace,scriptContext,true,resetStack);
    }
    bVar2 = ThreadContext::IsDisableImplicitCall
                      ((ThreadContext *)exceptionContext.m_originalStackTrace.ptr);
    if (((bVar2) &&
        (IVar3 = ThreadContext::GetImplicitCallFlags
                           ((ThreadContext *)exceptionContext.m_originalStackTrace.ptr),
        (IVar3 & ~ImplicitCall_None) != ImplicitCall_HasNoInfo)) &&
       (bVar2 = ThreadContext::IsDisableImplicitException
                          ((ThreadContext *)exceptionContext.m_originalStackTrace.ptr), bVar2)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                         ,0x538,
                         "(!( threadContext->IsDisableImplicitCall() && threadContext->GetImplicitCallFlags() & (~ImplicitCall_None) ) || !threadContext->IsDisableImplicitException())"
                         ,
                         "!( threadContext->IsDisableImplicitCall() && threadContext->GetImplicitCallFlags() & (~ImplicitCall_None) ) || !threadContext->IsDisableImplicitException()"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ThreadContext::ClearDisableImplicitFlags
              ((ThreadContext *)exceptionContext.m_originalStackTrace.ptr);
    if ((fillExceptionContext) && (considerPassingToDebugger)) {
      DispatchExceptionToDebugger(exceptionObject,scriptContext);
    }
  }
  bVar2 = JavascriptExceptionObject::IsPendingExceptionObject(exceptionObject);
  if (bVar2) {
    if (scriptContext == (ScriptContext *)0x0) {
      local_88 = ThreadContext::GetContextForCurrentThread();
    }
    else {
      local_88 = ScriptContext::GetThreadContext(scriptContext);
    }
    ThreadContext::SetHasThrownPendingException(local_88);
  }
  DoThrow(exceptionObject,scriptContext);
}

Assistant:

void JavascriptExceptionOperators::ThrowExceptionObjectInternal(Js::JavascriptExceptionObject * exceptionObject, ScriptContext* scriptContext, bool fillExceptionContext, bool considerPassingToDebugger, PVOID returnAddress, bool resetStack)
    {
        if (scriptContext)
        {
            ThreadContext *threadContext = scriptContext->GetThreadContext();
#if ENABLE_JS_REENTRANCY_CHECK
            threadContext->SetNoJsReentrancy(false);
#endif
            if (fillExceptionContext)
            {
                Assert(exceptionObject);

                JavascriptExceptionContext exceptionContext;
                Var thrownObject = exceptionObject->GetThrownObject(nullptr);
                WalkStackForExceptionContext(*scriptContext, exceptionContext, thrownObject, StackCrawlLimitOnThrow(thrownObject, *scriptContext), returnAddress, /*isThrownException=*/ true, resetStack);
                exceptionObject->FillError(exceptionContext, scriptContext);
                AddStackTraceToObject(thrownObject, exceptionContext.GetStackTrace(), *scriptContext, /*isThrownException=*/ true, resetStack);
            }
            Assert(// If we disabled implicit calls and we did record an implicit call, do not throw.
                   // Check your helper to see if a call recorded an implicit call that might cause an invalid value
                   !(
                       threadContext->IsDisableImplicitCall() &&
                       threadContext->GetImplicitCallFlags() & (~ImplicitCall_None)
                    ) ||
                   // Make sure we didn't disable exceptions
                   !threadContext->IsDisableImplicitException()
            );

            threadContext->ClearDisableImplicitFlags();

            if (fillExceptionContext && considerPassingToDebugger)
            {
                DispatchExceptionToDebugger(exceptionObject, scriptContext);
            }
        }

        if (exceptionObject->IsPendingExceptionObject())
        {
            ThreadContext * threadContext = scriptContext? scriptContext->GetThreadContext() : ThreadContext::GetContextForCurrentThread();
            threadContext->SetHasThrownPendingException();
        }

        DoThrow(exceptionObject, scriptContext);
    }